

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::GetConfigAttribCase::iterate(GetConfigAttribCase *this)

{
  bool bVar1;
  deUint32 err;
  reference ppvVar2;
  MessageBuilder *pMVar3;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_4d8;
  void **local_4d0;
  MessageBuilder local_4c8;
  MessageBuilder local_348;
  EGLint local_1c4;
  EGLConfig pvStack_1c0;
  EGLint id;
  EGLConfig config;
  MessageBuilder local_1a8;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_28;
  TestLog *local_20;
  TestLog *log;
  GetConfigAttribCase *this_local;
  
  log = (TestLog *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  local_28._M_current = (void **)std::vector<void_*,_std::allocator<void_*>_>::end(&this->m_configs)
  ;
  bVar1 = __gnu_cxx::operator==(&this->m_configsIter,&local_28);
  if (bVar1) {
    tcu::TestLog::operator<<(&local_1a8,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [22])"No configs available.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_local._4_4_ = STOP;
  }
  else {
    ppvVar2 = __gnu_cxx::
              __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&this->m_configsIter);
    pvStack_1c0 = *ppvVar2;
    eglu::CallLogWrapper::eglGetConfigAttrib
              (&this->super_CallLogWrapper,this->m_display,pvStack_1c0,0x3028,&local_1c4);
    err = eglu::CallLogWrapper::eglGetError(&this->super_CallLogWrapper);
    eglu::checkError(err,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryConfigTests.cpp"
                     ,0xfd);
    tcu::TestLog::operator<<(&local_348,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [11])"Config ID ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c4);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,pvStack_1c0);
    tcu::TestLog::operator<<(&local_4c8,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<(&local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c8);
    local_4d0 = (void **)__gnu_cxx::
                         __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>
                         ::operator++(&this->m_configsIter,0);
    local_4d8._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::end(&this->m_configs);
    bVar1 = __gnu_cxx::operator==(&this->m_configsIter,&local_4d8);
    if (bVar1) {
      this_local._4_4_ = STOP;
    }
    else {
      this_local._4_4_ = CONTINUE;
    }
  }
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult GetConfigAttribCase::iterate (void)
{
	tcu::TestLog&	log		= m_testCtx.getLog();

	if (m_configsIter == m_configs.end())
	{
		log << TestLog::Message << "No configs available." << TestLog::EndMessage;
		return STOP;
	}

	{
		const EGLConfig	config	= *m_configsIter;
		EGLint			id;

		eglGetConfigAttrib(m_display, config, EGL_CONFIG_ID, &id);
		eglu::checkError(eglGetError(), DE_NULL, __FILE__, __LINE__);
		log << TestLog::Message << "Config ID " << id << TestLog::EndMessage;

		executeTest(config);
	}

	log << TestLog::Message << TestLog::EndMessage;

	m_configsIter++;

	if (m_configsIter == m_configs.end())
		return STOP;
	else
		return CONTINUE;
}